

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O1

int get_param_part(OperationConfig *config,char endchar,char **str,char **pdata,char **ptype,
                  char **pfilename,char **pencoder,curl_slist **pheaders)

{
  byte bVar1;
  FILE *pFVar2;
  GlobalConfig *config_00;
  int iVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  byte *pbVar7;
  size_t sVar8;
  size_t sVar9;
  curl_slist *pcVar10;
  int *piVar11;
  char *pcVar12;
  uint uVar13;
  undefined7 in_register_00000031;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  byte *pbVar17;
  byte *pbVar18;
  long lVar19;
  bool bVar20;
  int lineno;
  char type_minor [128];
  char type_major [128];
  char hdrbuf [999];
  byte *local_590;
  byte *local_588;
  OperationConfig *local_580;
  int local_574;
  curl_slist *local_570;
  byte *local_568;
  int local_55c;
  undefined4 local_558;
  uint local_554;
  byte *local_550;
  byte *local_548;
  FILE *local_540;
  byte *local_538;
  char **local_530;
  char **local_528;
  char **local_520;
  char local_518 [1256];
  
  local_558 = (undefined4)CONCAT71(in_register_00000031,endchar);
  local_590 = (byte *)*str;
  local_518[0xf0] = '\0';
  local_518[0xf1] = '\0';
  local_518[0xf2] = '\0';
  local_518[0xf3] = '\0';
  local_518[0xf4] = '\0';
  local_518[0xf5] = '\0';
  local_518[0xf6] = '\0';
  local_518[0xf7] = '\0';
  local_518[0xf8] = '\0';
  local_518[0xf9] = '\0';
  local_518[0xfa] = '\0';
  local_518[0xfb] = '\0';
  local_518[0xfc] = '\0';
  local_518[0xfd] = '\0';
  local_518[0xfe] = '\0';
  local_518[0xff] = '\0';
  local_518[0xe0] = '\0';
  local_518[0xe1] = '\0';
  local_518[0xe2] = '\0';
  local_518[0xe3] = '\0';
  local_518[0xe4] = '\0';
  local_518[0xe5] = '\0';
  local_518[0xe6] = '\0';
  local_518[0xe7] = '\0';
  local_518[0xe8] = '\0';
  local_518[0xe9] = '\0';
  local_518[0xea] = '\0';
  local_518[0xeb] = '\0';
  local_518[0xec] = '\0';
  local_518[0xed] = '\0';
  local_518[0xee] = '\0';
  local_518[0xef] = '\0';
  local_518[0xd0] = '\0';
  local_518[0xd1] = '\0';
  local_518[0xd2] = '\0';
  local_518[0xd3] = '\0';
  local_518[0xd4] = '\0';
  local_518[0xd5] = '\0';
  local_518[0xd6] = '\0';
  local_518[0xd7] = '\0';
  local_518[0xd8] = '\0';
  local_518[0xd9] = '\0';
  local_518[0xda] = '\0';
  local_518[0xdb] = '\0';
  local_518[0xdc] = '\0';
  local_518[0xdd] = '\0';
  local_518[0xde] = '\0';
  local_518[0xdf] = '\0';
  local_518[0xc0] = '\0';
  local_518[0xc1] = '\0';
  local_518[0xc2] = '\0';
  local_518[0xc3] = '\0';
  local_518[0xc4] = '\0';
  local_518[0xc5] = '\0';
  local_518[0xc6] = '\0';
  local_518[199] = '\0';
  local_518[200] = '\0';
  local_518[0xc9] = '\0';
  local_518[0xca] = '\0';
  local_518[0xcb] = '\0';
  local_518[0xcc] = '\0';
  local_518[0xcd] = '\0';
  local_518[0xce] = '\0';
  local_518[0xcf] = '\0';
  local_518[0xb0] = '\0';
  local_518[0xb1] = '\0';
  local_518[0xb2] = '\0';
  local_518[0xb3] = '\0';
  local_518[0xb4] = '\0';
  local_518[0xb5] = '\0';
  local_518[0xb6] = '\0';
  local_518[0xb7] = '\0';
  local_518[0xb8] = '\0';
  local_518[0xb9] = '\0';
  local_518[0xba] = '\0';
  local_518[0xbb] = '\0';
  local_518[0xbc] = '\0';
  local_518[0xbd] = '\0';
  local_518[0xbe] = '\0';
  local_518[0xbf] = '\0';
  local_518[0xa0] = '\0';
  local_518[0xa1] = '\0';
  local_518[0xa2] = '\0';
  local_518[0xa3] = '\0';
  local_518[0xa4] = '\0';
  local_518[0xa5] = '\0';
  local_518[0xa6] = '\0';
  local_518[0xa7] = '\0';
  local_518[0xa8] = '\0';
  local_518[0xa9] = '\0';
  local_518[0xaa] = '\0';
  local_518[0xab] = '\0';
  local_518[0xac] = '\0';
  local_518[0xad] = '\0';
  local_518[0xae] = '\0';
  local_518[0xaf] = '\0';
  local_518[0x90] = '\0';
  local_518[0x91] = '\0';
  local_518[0x92] = '\0';
  local_518[0x93] = '\0';
  local_518[0x94] = '\0';
  local_518[0x95] = '\0';
  local_518[0x96] = '\0';
  local_518[0x97] = '\0';
  local_518[0x98] = '\0';
  local_518[0x99] = '\0';
  local_518[0x9a] = '\0';
  local_518[0x9b] = '\0';
  local_518[0x9c] = '\0';
  local_518[0x9d] = '\0';
  local_518[0x9e] = '\0';
  local_518[0x9f] = '\0';
  local_518[0x80] = '\0';
  local_518[0x81] = '\0';
  local_518[0x82] = '\0';
  local_518[0x83] = '\0';
  local_518[0x84] = '\0';
  local_518[0x85] = '\0';
  local_518[0x86] = '\0';
  local_518[0x87] = '\0';
  local_518[0x88] = '\0';
  local_518[0x89] = '\0';
  local_518[0x8a] = '\0';
  local_518[0x8b] = '\0';
  local_518[0x8c] = '\0';
  local_518[0x8d] = '\0';
  local_518[0x8e] = '\0';
  local_518[0x8f] = '\0';
  local_518[0x70] = '\0';
  local_518[0x71] = '\0';
  local_518[0x72] = '\0';
  local_518[0x73] = '\0';
  local_518[0x74] = '\0';
  local_518[0x75] = '\0';
  local_518[0x76] = '\0';
  local_518[0x77] = '\0';
  local_518[0x78] = '\0';
  local_518[0x79] = '\0';
  local_518[0x7a] = '\0';
  local_518[0x7b] = '\0';
  local_518[0x7c] = '\0';
  local_518[0x7d] = '\0';
  local_518[0x7e] = '\0';
  local_518[0x7f] = '\0';
  local_518[0x60] = '\0';
  local_518[0x61] = '\0';
  local_518[0x62] = '\0';
  local_518[99] = '\0';
  local_518[100] = '\0';
  local_518[0x65] = '\0';
  local_518[0x66] = '\0';
  local_518[0x67] = '\0';
  local_518[0x68] = '\0';
  local_518[0x69] = '\0';
  local_518[0x6a] = '\0';
  local_518[0x6b] = '\0';
  local_518[0x6c] = '\0';
  local_518[0x6d] = '\0';
  local_518[0x6e] = '\0';
  local_518[0x6f] = '\0';
  local_518[0x50] = '\0';
  local_518[0x51] = '\0';
  local_518[0x52] = '\0';
  local_518[0x53] = '\0';
  local_518[0x54] = '\0';
  local_518[0x55] = '\0';
  local_518[0x56] = '\0';
  local_518[0x57] = '\0';
  local_518[0x58] = '\0';
  local_518[0x59] = '\0';
  local_518[0x5a] = '\0';
  local_518[0x5b] = '\0';
  local_518[0x5c] = '\0';
  local_518[0x5d] = '\0';
  local_518[0x5e] = '\0';
  local_518[0x5f] = '\0';
  local_518[0x40] = '\0';
  local_518[0x41] = '\0';
  local_518[0x42] = '\0';
  local_518[0x43] = '\0';
  local_518[0x44] = '\0';
  local_518[0x45] = '\0';
  local_518[0x46] = '\0';
  local_518[0x47] = '\0';
  local_518[0x48] = '\0';
  local_518[0x49] = '\0';
  local_518[0x4a] = '\0';
  local_518[0x4b] = '\0';
  local_518[0x4c] = '\0';
  local_518[0x4d] = '\0';
  local_518[0x4e] = '\0';
  local_518[0x4f] = '\0';
  local_518[0x30] = '\0';
  local_518[0x31] = '\0';
  local_518[0x32] = '\0';
  local_518[0x33] = '\0';
  local_518[0x34] = '\0';
  local_518[0x35] = '\0';
  local_518[0x36] = '\0';
  local_518[0x37] = '\0';
  local_518[0x38] = '\0';
  local_518[0x39] = '\0';
  local_518[0x3a] = '\0';
  local_518[0x3b] = '\0';
  local_518[0x3c] = '\0';
  local_518[0x3d] = '\0';
  local_518[0x3e] = '\0';
  local_518[0x3f] = '\0';
  local_518[0x20] = '\0';
  local_518[0x21] = '\0';
  local_518[0x22] = '\0';
  local_518[0x23] = '\0';
  local_518[0x24] = '\0';
  local_518[0x25] = '\0';
  local_518[0x26] = '\0';
  local_518[0x27] = '\0';
  local_518[0x28] = '\0';
  local_518[0x29] = '\0';
  local_518[0x2a] = '\0';
  local_518[0x2b] = '\0';
  local_518[0x2c] = '\0';
  local_518[0x2d] = '\0';
  local_518[0x2e] = '\0';
  local_518[0x2f] = '\0';
  local_518[0x10] = '\0';
  local_518[0x11] = '\0';
  local_518[0x12] = '\0';
  local_518[0x13] = '\0';
  local_518[0x14] = '\0';
  local_518[0x15] = '\0';
  local_518[0x16] = '\0';
  local_518[0x17] = '\0';
  local_518[0x18] = '\0';
  local_518[0x19] = '\0';
  local_518[0x1a] = '\0';
  local_518[0x1b] = '\0';
  local_518[0x1c] = '\0';
  local_518[0x1d] = '\0';
  local_518[0x1e] = '\0';
  local_518[0x1f] = '\0';
  local_518[0] = '\0';
  local_518[1] = '\0';
  local_518[2] = '\0';
  local_518[3] = '\0';
  local_518[4] = '\0';
  local_518[5] = '\0';
  local_518[6] = '\0';
  local_518[7] = '\0';
  local_518[8] = '\0';
  local_518[9] = '\0';
  local_518[10] = '\0';
  local_518[0xb] = '\0';
  local_518[0xc] = '\0';
  local_518[0xd] = '\0';
  local_518[0xe] = '\0';
  local_518[0xf] = '\0';
  if (ptype != (char **)0x0) {
    *ptype = (char *)0x0;
  }
  if (pfilename != (char **)0x0) {
    *pfilename = (char *)0x0;
  }
  if (pheaders != (curl_slist **)0x0) {
    *pheaders = (curl_slist *)0x0;
  }
  if (pencoder != (char **)0x0) {
    *pencoder = (char *)0x0;
  }
  pbVar17 = local_590 + -1;
  local_580 = config;
  local_528 = ptype;
  local_520 = str;
  do {
    pbVar6 = pbVar17 + 1;
    pbVar17 = pbVar17 + 1;
    iVar3 = Curl_isspace((uint)*pbVar6);
  } while (iVar3 != 0);
  local_574 = (int)(char)(byte)local_558;
  local_590 = pbVar17;
  pbVar6 = (byte *)get_param_word((char **)&local_590,(char **)&local_588,(byte)local_558);
  *pdata = (char *)pbVar6;
  if (pbVar17 == pbVar6) {
    while ((*pdata < local_588 && (iVar3 = Curl_isspace((uint)local_588[-1]), iVar3 != 0))) {
      local_588 = local_588 + -1;
    }
  }
  bVar1 = *local_590;
  uVar13 = (uint)bVar1;
  *local_588 = 0;
  if (bVar1 == 0x3b) {
    pbVar17 = (byte *)0x0;
    local_548 = (byte *)0x0;
    local_550 = (byte *)0x0;
    pbVar6 = (byte *)0x0;
    local_570 = (curl_slist *)0x0;
    local_530 = pfilename;
    do {
      pbVar18 = local_590;
      local_568 = pbVar17;
      do {
        pbVar17 = pbVar18;
        pbVar18 = pbVar17 + 1;
        iVar3 = Curl_isspace((uint)pbVar17[1]);
      } while (iVar3 != 0);
      local_590 = pbVar18;
      if ((pbVar6 == (byte *)0x0) && (iVar3 = curl_strnequal("type=",pbVar18,5), iVar3 != 0)) {
        pbVar6 = pbVar17 + 6;
        do {
          pbVar17 = pbVar6;
          local_590 = pbVar17;
          iVar3 = Curl_isspace((uint)*pbVar17);
          pbVar6 = pbVar17 + 1;
        } while (iVar3 != 0);
        iVar3 = __isoc99_sscanf(pbVar17,"%127[^/ ]/%127[^;, \n]",local_518 + 0x80,local_518);
        if (iVar3 != 2) {
          warnf(local_580->global,"Illegally formatted content-type field!\n");
          goto LAB_0010e191;
        }
        sVar8 = strlen(local_518 + 0x80);
        sVar9 = strlen(local_518);
        pbVar18 = pbVar17 + 1 + sVar9 + sVar8;
        pbVar6 = pbVar18;
        while( true ) {
          bVar1 = *pbVar18;
          uVar13 = (uint)bVar1;
          if (((bVar1 == 0) || (bVar1 == 0x3b)) || (bVar1 == (byte)local_558)) break;
          local_590 = pbVar18;
          iVar3 = Curl_isspace((uint)bVar1);
          pbVar18 = pbVar18 + 1;
          if (iVar3 == 0) {
            pbVar6 = pbVar18;
          }
        }
      }
      else {
        iVar3 = curl_strnequal("filename=",pbVar18,9);
        if (iVar3 == 0) {
          iVar3 = curl_strnequal("headers=",pbVar18,8);
          if (iVar3 == 0) {
            iVar3 = curl_strnequal("encoder=",pbVar18,8);
            if (iVar3 != 0) {
              if (pbVar6 != (byte *)0x0) {
                *pbVar6 = 0;
              }
              pbVar17 = local_590 + 7;
              do {
                pbVar6 = pbVar17 + 1;
                pbVar17 = pbVar17 + 1;
                iVar3 = Curl_isspace((uint)*pbVar6);
              } while (iVar3 != 0);
              local_590 = pbVar17;
              pbVar18 = (byte *)get_param_word((char **)&local_590,(char **)&local_588,
                                               (char)local_574);
              pbVar6 = local_588;
              pbVar7 = local_548;
              if (pbVar17 == pbVar18) {
                while ((pbVar7 = local_548, pbVar18 < pbVar6 &&
                       (iVar3 = Curl_isspace((uint)pbVar6[-1]), pbVar7 = local_548, iVar3 != 0))) {
                  pbVar6 = pbVar6 + -1;
                }
              }
              goto LAB_0010dbfe;
            }
            bVar20 = pbVar6 != (byte *)0x0;
            pbVar6 = pbVar18;
            pbVar18 = local_590;
            if (bVar20) {
              while( true ) {
                bVar1 = *pbVar18;
                uVar13 = (uint)bVar1;
                pbVar17 = local_568;
                if (((bVar1 == 0) || (bVar1 == 0x3b)) || (bVar1 == (byte)local_558)) break;
                iVar3 = Curl_isspace((uint)bVar1);
                pbVar18 = pbVar18 + 1;
                if (iVar3 == 0) {
                  pbVar6 = pbVar18;
                }
              }
              goto LAB_0010df17;
            }
            pcVar12 = get_param_word((char **)&local_590,(char **)&local_588,(char)local_574);
            uVar13 = (uint)*local_590;
            *local_588 = 0;
            if (*pcVar12 != '\0') {
              warnf(local_580->global,"skip unknown form field: %s\n",pcVar12);
            }
          }
          else {
            if (pbVar6 != (byte *)0x0) {
              *pbVar6 = 0;
            }
            pbVar17 = local_590 + 8;
            pbVar6 = pbVar17;
            if ((local_590[8] == 0x3c) || (local_590[8] == 0x40)) {
              do {
                local_590 = pbVar6;
                pbVar6 = pbVar17 + 1;
                pbVar17 = pbVar17 + 1;
                iVar3 = Curl_isspace((uint)*pbVar6);
                pbVar6 = local_590;
              } while (iVar3 != 0);
              local_590 = pbVar17;
              pbVar18 = (byte *)get_param_word((char **)&local_590,(char **)&local_588,
                                               (char)local_574);
              pbVar6 = local_588;
              if (pbVar17 == pbVar18) {
                while ((pbVar18 < pbVar6 && (iVar3 = Curl_isspace((uint)pbVar6[-1]), iVar3 != 0))) {
                  pbVar6 = pbVar6 + -1;
                }
              }
              local_588 = pbVar6;
              uVar13 = (uint)*local_590;
              *local_588 = 0;
              local_540 = fopen64((char *)pbVar18,"r");
              if (local_540 != (FILE *)0x0) {
                local_554 = 1;
                uVar15 = 0;
                lVar19 = 0;
                bVar16 = false;
                bVar20 = false;
                local_538 = pbVar18;
                do {
                  uVar4 = getc(local_540);
                  if ((uVar4 == 0xffffffff) ||
                     ((lVar19 == 0 && (iVar3 = Curl_isspace(uVar4 & 0xff), iVar3 == 0)))) {
                    uVar15 = uVar15 + 1;
                    do {
                      uVar14 = uVar15;
                      pcVar10 = local_570;
                      if (uVar14 == 1) goto LAB_0010ddad;
                      iVar3 = Curl_isspace((uint)(byte)local_518[uVar14 + 0xfe]);
                      uVar15 = uVar14 - 1;
                    } while (iVar3 != 0);
                    local_518[uVar14 + 0xff] = '\0';
                    pcVar10 = (curl_slist *)curl_slist_append(local_570,local_518 + 0x100);
                    if (pcVar10 != (curl_slist *)0x0) {
LAB_0010ddad:
                      local_570 = pcVar10;
                      uVar15 = 0;
                      goto LAB_0010ddb0;
                    }
                    curl_mfprintf(local_580->global->errors,"Out of memory for field headers!\n");
LAB_0010dec3:
                    iVar3 = 1;
                    local_55c = -1;
                  }
                  else {
LAB_0010ddb0:
                    iVar3 = 3;
                    if ((int)uVar4 < 0xd) {
                      if (uVar4 == 0xffffffff) {
                        iVar5 = ferror(local_540);
                        iVar3 = 1;
                        if (iVar5 != 0) {
                          pFVar2 = local_580->global->errors;
                          piVar11 = __errno_location();
                          pcVar12 = strerror(*piVar11);
                          curl_mfprintf(pFVar2,"Header file %s read error: %s\n",local_538,pcVar12);
                          goto LAB_0010dec3;
                        }
                        local_55c = 0;
                      }
                      else {
                        if (uVar4 != 10) goto LAB_0010ddf6;
                        local_554 = local_554 + 1;
                        lVar19 = 0;
                        bVar16 = false;
                        bVar20 = false;
                      }
                    }
                    else if (uVar4 != 0xd) {
                      if ((uVar4 == 0x23) && (bVar20 = bVar16, lVar19 == 0)) {
                        bVar16 = true;
                        bVar20 = true;
                      }
LAB_0010ddf6:
                      lVar19 = lVar19 + 1;
                      iVar3 = 0;
                      if (!bVar20) {
                        if (uVar15 == 0x3e6) {
                          warnf(local_580->global,"File %s line %d: header too long (truncated)\n",
                                local_538,(ulong)local_554);
                          uVar4 = 0x20;
                        }
                        if (uVar15 < 999) {
                          local_518[uVar15 + 0x100] = (char)uVar4;
                          uVar15 = uVar15 + 1;
                        }
                      }
                    }
                  }
                } while ((iVar3 == 0) || (iVar3 == 3));
                fclose(local_540);
                if (local_55c != 0) goto LAB_0010e191;
                pbVar6 = (byte *)0x0;
                pbVar17 = local_568;
                pfilename = local_530;
                pbVar18 = local_590;
                goto LAB_0010df17;
              }
              config_00 = local_580->global;
              piVar11 = __errno_location();
              pcVar12 = strerror(*piVar11);
              warnf(config_00,"Cannot read from %s: %s\n",pbVar18,pcVar12);
            }
            else {
              pbVar6 = local_590 + 7;
              local_590 = pbVar17;
              do {
                pbVar17 = pbVar6 + 1;
                pbVar6 = pbVar6 + 1;
                iVar3 = Curl_isspace((uint)*pbVar17);
              } while (iVar3 != 0);
              local_590 = pbVar6;
              pbVar18 = (byte *)get_param_word((char **)&local_590,(char **)&local_588,
                                               (char)local_574);
              pbVar17 = local_588;
              if (pbVar6 == pbVar18) {
                while ((pbVar18 < pbVar17 && (iVar3 = Curl_isspace((uint)pbVar17[-1]), iVar3 != 0)))
                {
                  pbVar17 = pbVar17 + -1;
                }
              }
              local_588 = pbVar17;
              pcVar10 = local_570;
              uVar13 = (uint)*local_590;
              *local_588 = 0;
              local_570 = (curl_slist *)curl_slist_append(local_570,pbVar18);
              if (local_570 == (curl_slist *)0x0) {
                local_570 = pcVar10;
                curl_mfprintf(local_580->global->errors,"Out of memory for field header!\n");
LAB_0010e191:
                curl_slist_free_all(local_570);
                return -1;
              }
            }
          }
        }
        else {
          if (pbVar6 != (byte *)0x0) {
            *pbVar6 = 0;
          }
          pbVar17 = local_590 + 8;
          do {
            pbVar6 = pbVar17 + 1;
            pbVar17 = pbVar17 + 1;
            iVar3 = Curl_isspace((uint)*pbVar6);
          } while (iVar3 != 0);
          local_590 = pbVar17;
          pbVar7 = (byte *)get_param_word((char **)&local_590,(char **)&local_588,(char)local_574);
          pbVar6 = local_588;
          pbVar18 = local_550;
          if (pbVar17 == pbVar7) {
            while ((pbVar18 = local_550, pbVar7 < pbVar6 &&
                   (iVar3 = Curl_isspace((uint)pbVar6[-1]), pbVar18 = local_550, iVar3 != 0))) {
              pbVar6 = pbVar6 + -1;
            }
          }
LAB_0010dbfe:
          local_548 = pbVar7;
          local_550 = pbVar18;
          local_588 = pbVar6;
          uVar13 = (uint)*local_590;
          *local_588 = 0;
        }
        pbVar6 = (byte *)0x0;
        pbVar17 = local_568;
        pbVar18 = local_590;
      }
LAB_0010df17:
      local_590 = pbVar18;
    } while ((char)uVar13 == ';');
  }
  else {
    local_570 = (curl_slist *)0x0;
    pbVar6 = (byte *)0x0;
    local_550 = (byte *)0x0;
    local_548 = (byte *)0x0;
    pbVar17 = (byte *)0x0;
  }
  pbVar18 = local_548;
  if (pbVar6 != (byte *)0x0) {
    *pbVar6 = 0;
  }
  if (local_528 == (char **)0x0) {
    if (pbVar17 != (byte *)0x0) {
      warnf(local_580->global,"Field content type not allowed here: %s\n");
    }
  }
  else {
    *local_528 = (char *)pbVar17;
  }
  if (pfilename == (char **)0x0) {
    if (pbVar18 != (byte *)0x0) {
      warnf(local_580->global,"Field file name not allowed here: %s\n",pbVar18);
    }
  }
  else {
    *pfilename = (char *)pbVar18;
  }
  if (pencoder == (char **)0x0) {
    if (local_550 != (byte *)0x0) {
      warnf(local_580->global,"Field encoder not allowed here: %s\n");
    }
  }
  else {
    *pencoder = (char *)local_550;
  }
  pcVar10 = local_570;
  if (pheaders == (curl_slist **)0x0) {
    if (local_570 != (curl_slist *)0x0) {
      warnf(local_580->global,"Field headers not allowed here: %s\n",local_570->data);
      curl_slist_free_all(pcVar10);
    }
  }
  else {
    *pheaders = local_570;
  }
  *local_520 = (char *)local_590;
  return uVar13;
}

Assistant:

static int get_param_part(struct OperationConfig *config, char endchar,
                          char **str, char **pdata, char **ptype,
                          char **pfilename, char **pencoder,
                          struct curl_slist **pheaders)
{
  char *p = *str;
  char *type = NULL;
  char *filename = NULL;
  char *encoder = NULL;
  char *endpos;
  char *tp;
  char sep;
  char type_major[128] = "";
  char type_minor[128] = "";
  char *endct = NULL;
  struct curl_slist *headers = NULL;

  if(ptype)
    *ptype = NULL;
  if(pfilename)
    *pfilename = NULL;
  if(pheaders)
    *pheaders = NULL;
  if(pencoder)
    *pencoder = NULL;
  while(ISSPACE(*p))
    p++;
  tp = p;
  *pdata = get_param_word(&p, &endpos, endchar);
  /* If not quoted, strip trailing spaces. */
  if(*pdata == tp)
    while(endpos > *pdata && ISSPACE(endpos[-1]))
      endpos--;
  sep = *p;
  *endpos = '\0';
  while(sep == ';') {
    while(ISSPACE(*++p))
      ;

    if(!endct && checkprefix("type=", p)) {
      for(p += 5; ISSPACE(*p); p++)
        ;
      /* set type pointer */
      type = p;

      /* verify that this is a fine type specifier */
      if(2 != sscanf(type, "%127[^/ ]/%127[^;, \n]", type_major, type_minor)) {
        warnf(config->global, "Illegally formatted content-type field!\n");
        curl_slist_free_all(headers);
        return -1; /* illegal content-type syntax! */
      }

      /* now point beyond the content-type specifier */
      p = type + strlen(type_major) + strlen(type_minor) + 1;
      for(endct = p; *p && *p != ';' && *p != endchar; p++)
        if(!ISSPACE(*p))
          endct = p + 1;
      sep = *p;
    }
    else if(checkprefix("filename=", p)) {
      if(endct) {
        *endct = '\0';
        endct = NULL;
      }
      for(p += 9; ISSPACE(*p); p++)
        ;
      tp = p;
      filename = get_param_word(&p, &endpos, endchar);
      /* If not quoted, strip trailing spaces. */
      if(filename == tp)
        while(endpos > filename && ISSPACE(endpos[-1]))
          endpos--;
      sep = *p;
      *endpos = '\0';
    }
    else if(checkprefix("headers=", p)) {
      if(endct) {
        *endct = '\0';
        endct = NULL;
      }
      p += 8;
      if(*p == '@' || *p == '<') {
        char *hdrfile;
        FILE *fp;
        /* Read headers from a file. */

        do {
          p++;
        } while(ISSPACE(*p));
        tp = p;
        hdrfile = get_param_word(&p, &endpos, endchar);
        /* If not quoted, strip trailing spaces. */
        if(hdrfile == tp)
          while(endpos > hdrfile && ISSPACE(endpos[-1]))
            endpos--;
        sep = *p;
        *endpos = '\0';
        fp = fopen(hdrfile, FOPEN_READTEXT);
        if(!fp)
          warnf(config->global, "Cannot read from %s: %s\n", hdrfile,
                strerror(errno));
        else {
          int i = read_field_headers(config, hdrfile, fp, &headers);

          fclose(fp);
          if(i) {
            curl_slist_free_all(headers);
            return -1;
          }
        }
      }
      else {
        char *hdr;

        while(ISSPACE(*p))
          p++;
        tp = p;
        hdr = get_param_word(&p, &endpos, endchar);
        /* If not quoted, strip trailing spaces. */
        if(hdr == tp)
          while(endpos > hdr && ISSPACE(endpos[-1]))
            endpos--;
        sep = *p;
        *endpos = '\0';
        if(slist_append(&headers, hdr)) {
          fprintf(config->global->errors, "Out of memory for field header!\n");
          curl_slist_free_all(headers);
          return -1;
        }
      }
    }
    else if(checkprefix("encoder=", p)) {
      if(endct) {
        *endct = '\0';
        endct = NULL;
      }
      for(p += 8; ISSPACE(*p); p++)
        ;
      tp = p;
      encoder = get_param_word(&p, &endpos, endchar);
      /* If not quoted, strip trailing spaces. */
      if(encoder == tp)
        while(endpos > encoder && ISSPACE(endpos[-1]))
          endpos--;
      sep = *p;
      *endpos = '\0';
    }
    else if(endct) {
      /* This is part of content type. */
      for(endct = p; *p && *p != ';' && *p != endchar; p++)
        if(!ISSPACE(*p))
          endct = p + 1;
      sep = *p;
    }
    else {
      /* unknown prefix, skip to next block */
      char *unknown = get_param_word(&p, &endpos, endchar);

      sep = *p;
      *endpos = '\0';
      if(*unknown)
        warnf(config->global, "skip unknown form field: %s\n", unknown);
    }
  }

  /* Terminate content type. */
  if(endct)
    *endct = '\0';

  if(ptype)
    *ptype = type;
  else if(type)
    warnf(config->global, "Field content type not allowed here: %s\n", type);

  if(pfilename)
    *pfilename = filename;
  else if(filename)
    warnf(config->global,
          "Field file name not allowed here: %s\n", filename);

  if(pencoder)
    *pencoder = encoder;
  else if(encoder)
    warnf(config->global,
          "Field encoder not allowed here: %s\n", encoder);

  if(pheaders)
    *pheaders = headers;
  else if(headers) {
    warnf(config->global,
          "Field headers not allowed here: %s\n", headers->data);
    curl_slist_free_all(headers);
  }

  *str = p;
  return sep & 0xFF;
}